

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

int __thiscall
CVmObjStringBuffer::getp_len(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_strbuf_ext *pvVar2;
  vm_val_t *in_RDX;
  CVmObjStringBuffer *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_len(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_len(unsigned_int,vm_val_t*,unsigned_int*)::desc), iVar1 != 0
     )) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_len::desc,0);
    __cxa_guard_release(&getp_len(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    pvVar2 = get_ext(in_RDI);
    vm_val_t::set_int(in_RDX,pvVar2->len);
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_len(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the content length */
    retval->set_int(get_ext()->len);

    /* handled */
    return TRUE;
}